

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O2

Image * __thiscall
vera::Material::getImage(Image *__return_storage_ptr__,Material *this,string *_property)

{
  const_iterator cVar1;
  
  cVar1 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image_*>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image_*>_>_>
          ::find(&(this->textures)._M_t,_property);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->textures)._M_t._M_impl.super__Rb_tree_header) {
    Image::Image(__return_storage_ptr__);
  }
  else {
    Image::Image(__return_storage_ptr__,*(Image **)(cVar1._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

Image Material::getImage(const std::string& _property) const {
    const std::map<const std::string, Image*>::const_iterator it = textures.find(_property);
    if (it != textures.end() )
        return *it->second;

    Image none;
    return none;
}